

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void search234_step(search234_state *state,int direction)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  pvVar1 = state->_node;
  if (pvVar1 == (void *)0x0) {
    state->element = (void *)0x0;
    iVar4 = 0;
LAB_00101eb4:
    state->index = iVar4;
    return;
  }
  iVar4 = state->_last;
  if (iVar4 == -1) {
    state->_lo = 0;
  }
  else {
    if (direction == 0) {
      __assert_fail("direction",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                    ,0x27e,"void search234_step(search234_state *, int)");
    }
    if (direction < 1) {
      iVar4 = iVar4 + -1;
      state->_hi = iVar4;
      uVar2 = state->_lo;
    }
    else {
      uVar2 = iVar4 + 1;
      state->_lo = uVar2;
      iVar4 = state->_hi;
    }
    if ((int)uVar2 <= iVar4) goto LAB_00101f34;
    if (0 < (int)uVar2) {
      iVar4 = state->_base;
      uVar7 = 0;
      do {
        iVar4 = iVar4 + *(int *)((long)pvVar1 + uVar7 * 4 + 0x28) + 1;
        state->_base = iVar4;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    pvVar1 = *(void **)((long)pvVar1 + (long)(int)uVar2 * 8 + 8);
    state->_node = pvVar1;
    state->_last = -1;
    state->_lo = 0;
    if (pvVar1 == (void *)0x0) {
      state->_hi = 0;
      state->element = (void *)0x0;
      iVar4 = state->_base;
      goto LAB_00101eb4;
    }
  }
  lVar5 = 0;
  do {
    if (*(long *)((long)pvVar1 + lVar5 * 8 + 0x38) == 0) {
      iVar4 = (int)lVar5 + -1;
      goto LAB_00101f2f;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  iVar4 = 2;
LAB_00101f2f:
  state->_hi = iVar4;
  uVar2 = 0;
LAB_00101f34:
  iVar3 = (int)(iVar4 + uVar2) / 2;
  state->_last = iVar3;
  state->element = *(void **)((long)pvVar1 + (long)iVar3 * 8 + 0x38);
  iVar6 = iVar3 + state->_base;
  state->index = iVar6;
  if (-2 < (int)(iVar4 + uVar2)) {
    uVar7 = 0;
    do {
      iVar6 = iVar6 + *(int *)((long)pvVar1 + uVar7 * 4 + 0x28);
      state->index = iVar6;
      uVar7 = uVar7 + 1;
    } while (iVar3 + 1 != uVar7);
  }
  return;
}

Assistant:

void search234_step(search234_state *state, int direction)
{
    node234 *node = state->_node;
    int i;

    if (!node) {
        state->element = NULL;
        state->index = 0;
        return;
    }

    if (state->_last != -1) {
        /*
         * We're already pointing at some element of a node, so we
         * should restrict to the elements left or right of it,
         * depending on the requested search direction.
         */
        assert(direction);
        assert(node);

        if (direction > 0)
            state->_lo = state->_last + 1;
        else
            state->_hi = state->_last - 1;

        if (state->_lo > state->_hi) {
            /*
             * We've run out of elements in this node, i.e. we've
             * narrowed to nothing but a child pointer. Descend to
             * that child, and update _base to the leftmost index of
             * its subtree.
             */
            for (i = 0; i < state->_lo; i++)
                state->_base += 1 + node->counts[i];
            state->_node = node = node->kids[state->_lo];
            state->_last = -1;
        }
    }

    if (state->_last == -1) {
        /*
         * We've just entered a new node - either because of the above
         * code, or because we were called from search234_start - and
         * anything in that node is a viable answer.
         */
        state->_lo = 0;
        state->_hi = node ? elements234(node)-1 : 0;
    }

    /*
     * Now we've got something we can return.
     */
    if (!node) {
        state->element = NULL;
        state->index = state->_base;
    } else {
        state->_last = (state->_lo + state->_hi) / 2;
        state->element = node->elems[state->_last];
        state->index = state->_base + state->_last;
        for (i = 0; i <= state->_last; i++)
            state->index += node->counts[i];
    }
}